

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnEnd(TypeChecker *this)

{
  bool bVar1;
  Result RVar2;
  char *desc;
  Label *local_28;
  Label *label;
  TypeChecker *pTStack_18;
  Result result;
  TypeChecker *this_local;
  
  pTStack_18 = this;
  Result::Result((Result *)((long)&label + 4),Ok);
  RVar2 = TopLabel(this,&local_28);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    if (6 < (int)local_28->label_type) {
      __assert_fail("static_cast<int>(label->label_type) < kLabelTypeCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/type-checker.cc"
                    ,0x232,"Result wabt::TypeChecker::OnEnd()");
    }
    if (local_28->label_type == If) {
      RVar2 = OnElse(this);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar2 = OnEnd(this,local_28,OnEnd::s_label_type_name[(int)local_28->label_type],
                  OnEnd::s_label_type_name[(int)local_28->label_type]);
    Result::operator|=((Result *)((long)&label + 4),RVar2);
    this_local._4_4_ = label._4_4_;
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnEnd() {
  Result result = Result::Ok;
  static const char* s_label_type_name[] = {
      "function", "block", "loop", "if", "if false branch", "try", "try catch"};
  WABT_STATIC_ASSERT(WABT_ARRAY_SIZE(s_label_type_name) == kLabelTypeCount);
  Label* label;
  CHECK_RESULT(TopLabel(&label));
  assert(static_cast<int>(label->label_type) < kLabelTypeCount);
  if (label->label_type == LabelType::If) {
    // An if without an else will just pass the params through, so the result
    // types must be the same as the param types. It has the same behavior as
    // an empty else block.
    CHECK_RESULT(OnElse());
  }
  const char* desc = s_label_type_name[static_cast<int>(label->label_type)];
  result |= OnEnd(label, desc, desc);
  return result;
}